

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::ArrayMinMaxMethod::checkArguments
          (ArrayMinMaxMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *iterExpr)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  QueueType *pQVar2;
  Type *pTVar3;
  reference ppEVar4;
  Args *in_RCX;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  ASTContext *in_RDI;
  size_t in_R8;
  SystemSubroutine *in_R9;
  Type *elemType;
  Compilation *comp;
  string *arg;
  Diagnostic *this_01;
  Type *in_stack_ffffffffffffff58;
  BumpAllocator *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  SourceLocation in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  DiagCode code;
  size_t in_stack_fffffffffffffff8;
  
  code = SUB84((ulong)in_stack_ffffffffffffff80 >> 0x20,0);
  this_00 = ASTContext::getCompilation((ASTContext *)0x904af1);
  arg = (string *)0x0;
  this_01 = (Diagnostic *)0x0;
  callRange.endLoc = in_RSI;
  callRange.startLoc = in_RDX;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_R9,(ASTContext *)this_00,SUB81(in_R8 >> 0x38,0),in_RCX,callRange,in_R8,
                     in_stack_fffffffffffffff8);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,0);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x904b84);
    Type::getArrayElementType(in_stack_ffffffffffffff58);
    if (in_R9 == (SystemSubroutine *)0x0) {
      bVar1 = isComparable((Type *)this_01);
      if (!bVar1) {
        ppEVar4 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                             in_RDX,0);
        sourceRange_00.startLoc._4_4_ = in_stack_ffffffffffffff74;
        sourceRange_00.startLoc._0_4_ = in_stack_ffffffffffffff70;
        sourceRange_00.endLoc = ((*ppEVar4)->sourceRange).startLoc;
        ASTContext::addDiag(in_RDI,SUB84(((*ppEVar4)->sourceRange).endLoc,4),sourceRange_00);
        Diagnostic::operator<<(this_01,arg);
        pTVar3 = Compilation::getErrorType(this_00);
        return pTVar3;
      }
    }
    else {
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x904bb3);
      bVar1 = isComparable((Type *)this_01);
      if (!bVar1) {
        sourceRange.startLoc._4_4_ = in_stack_ffffffffffffff74;
        sourceRange.startLoc._0_4_ = in_stack_ffffffffffffff70;
        sourceRange.endLoc = in_stack_ffffffffffffff78;
        ASTContext::addDiag(in_RDI,code,sourceRange);
        Diagnostic::operator<<(this_01,arg);
        pTVar3 = Compilation::getErrorType(this_00);
        return pTVar3;
      }
    }
    pQVar2 = BumpAllocator::emplace<slang::ast::QueueType,slang::ast::Type_const&,unsigned_int>
                       (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(uint *)this_01);
  }
  else {
    pQVar2 = (QueueType *)Compilation::getErrorType(this_00);
  }
  return &pQVar2->super_Type;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* iterExpr) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 0))
            return comp.getErrorType();

        auto elemType = args[0]->type->getArrayElementType();
        SLANG_ASSERT(elemType);

        if (iterExpr) {
            if (!isComparable(*iterExpr->type)) {
                context.addDiag(diag::ArrayMethodComparable, iterExpr->sourceRange) << name;
                return comp.getErrorType();
            }
        }
        else if (!isComparable(*elemType)) {
            context.addDiag(diag::ArrayMethodComparable, args[0]->sourceRange) << name;
            return comp.getErrorType();
        }

        return *comp.emplace<QueueType>(*elemType, 0u);
    }